

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O3

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekf_h
          (AttitudeQuaternionEKF *this,VectorDynSize *xhat_k_plus_one,VectorDynSize *zhat_k_plus_one
          )

{
  ulong *puVar1;
  ulong *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  Index size;
  long lVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  Index index_1;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  PointerType ptr;
  double dVar16;
  
  lVar8 = iDynTree::VectorDynSize::size();
  lVar9 = iDynTree::VectorDynSize::size();
  if (lVar8 == lVar9) {
    lVar8 = iDynTree::VectorDynSize::size();
    lVar9 = iDynTree::VectorDynSize::size();
    if (lVar8 == lVar9) {
      pdVar10 = (double *)iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      dVar16 = *pdVar10;
      dVar4 = pdVar10[1];
      dVar5 = pdVar10[2];
      dVar6 = pdVar10[3];
      pdVar10 = (double *)iDynTree::VectorDynSize::operator()(zhat_k_plus_one,0);
      *pdVar10 = (dVar4 * dVar6 - dVar16 * dVar5) * -2.0;
      pdVar10 = (double *)iDynTree::VectorDynSize::operator()(zhat_k_plus_one,1);
      *pdVar10 = (dVar16 * dVar4 + dVar5 * dVar6) * -2.0;
      pdVar10 = (double *)iDynTree::VectorDynSize::operator()(zhat_k_plus_one,2);
      *pdVar10 = -(((dVar16 * dVar16 - dVar4 * dVar4) - dVar5 * dVar5) + dVar6 * dVar6);
      dVar3 = (this->m_gravity_direction).super_Vector3.m_data[2];
      if ((dVar3 != -1.0) || (NAN(dVar3))) {
        if ((dVar3 != 1.0) || (NAN(dVar3))) {
          pcVar14 = "filter assumes gravity pointing upward or downward only";
          goto LAB_00163210;
        }
        uVar11 = iDynTree::VectorDynSize::data();
        uVar12 = iDynTree::VectorDynSize::size();
        uVar13 = uVar12;
        if (((uVar11 & 7) == 0) &&
           (uVar13 = (ulong)((uint)(uVar11 >> 3) & 1), (long)uVar12 <= (long)uVar13)) {
          uVar13 = uVar12;
        }
        lVar8 = uVar12 - uVar13;
        if (0 < (long)uVar13) {
          uVar15 = 0;
          do {
            *(ulong *)(uVar11 + uVar15 * 8) = *(ulong *)(uVar11 + uVar15 * 8) ^ 0x8000000000000000;
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
        }
        uVar15 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
        if (1 < lVar8) {
          do {
            puVar1 = (ulong *)(uVar11 + uVar13 * 8);
            uVar7 = puVar1[1];
            puVar2 = (ulong *)(uVar11 + uVar13 * 8);
            *puVar2 = *puVar1 ^ 0x8000000000000000;
            puVar2[1] = uVar7 ^ 0x8000000000000000;
            uVar13 = uVar13 + 2;
          } while ((long)uVar13 < (long)uVar15);
        }
        if ((long)uVar15 < (long)uVar12) {
          do {
            *(ulong *)(uVar11 + uVar15 * 8) = *(ulong *)(uVar11 + uVar15 * 8) ^ 0x8000000000000000;
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
        }
      }
      if (this->m_output_size != 4) {
        return true;
      }
      dVar3 = dVar4 * dVar5 + dVar16 * dVar6;
      dVar16 = dVar6 * dVar6 + dVar5 * dVar5;
      dVar3 = atan2(dVar3 + dVar3,1.0 - (dVar16 + dVar16));
      pdVar10 = (double *)iDynTree::VectorDynSize::operator()(zhat_k_plus_one,3);
      *pdVar10 = dVar3;
      return true;
    }
    pcVar14 = "output size mismatch";
  }
  else {
    pcVar14 = "predicted state size mismatch";
  }
LAB_00163210:
  iDynTree::reportError("AttitudeQuaternionEKF","h",pcVar14);
  return false;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekf_h(const iDynTree::VectorDynSize& xhat_k_plus_one, iDynTree::VectorDynSize& zhat_k_plus_one)
{
    if (xhat_k_plus_one.size() != m_x.size())
    {
        reportError("AttitudeQuaternionEKF", "h", "predicted state size mismatch");
        return false;
    }

    if (zhat_k_plus_one.size() != m_y.size())
    {
        reportError("AttitudeQuaternionEKF", "h", "output size mismatch");
        return false;
    }

    // following computation is the same as R^T e_3
    iDynTree::UnitQuaternion q;
    toEigen(q) = toEigen(xhat_k_plus_one).block<4,1>(0, 0);
    double q1q3{q(1)*q(3)};
    double q0q2{q(0)*q(2)};
    double q2q3{q(2)*q(3)};
    double q0q1{q(0)*q(1)};
    double q0squared{q(0)*q(0)};
    double q1squared{q(1)*q(1)};
    double q2squared{q(2)*q(2)};
    double q3squared{q(3)*q(3)};

    zhat_k_plus_one(0) = -2*(q1q3 - q0q2);
    zhat_k_plus_one(1) = -2*(q2q3 + q0q1);
    zhat_k_plus_one(2) = -(q0squared - q1squared - q2squared + q3squared);
    if (m_gravity_direction(2) == -1)
    {
        // have same zhat
    }
    else if (m_gravity_direction(2) == 1)
    {
        toEigen(zhat_k_plus_one) *= -1;
    }
    else
    {
        reportError("AttitudeQuaternionEKF", "h", "filter assumes gravity pointing upward or downward only");
        return false;
    }

    // magnetometer measurement gives us yaw
    if (m_output_size == output_dimensions_with_magnetometer)
    {
        double q0q3{q(0)*q(3)};
        double q1q2{q(1)*q(2)};
        zhat_k_plus_one(3) = std::atan2(2*(q0q3+q1q2), 1 - 2*(q2squared + q3squared));
    }

    return true;
}